

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O2

range * __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::operator[](map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             *this,domain *d)

{
  uint *puVar1;
  bool bVar2;
  unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_> *puVar3;
  ostream *poVar4;
  fatal_error *this_00;
  string local_1b0;
  ostringstream dlib_o_out;
  uint auStack_178 [88];
  
  bVar2 = map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::is_in_domain((map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                          *)this,d);
  if (bVar2) {
    puVar3 = binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
             ::operator[]((binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
                           *)(this + 0x10),d);
    return puVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar4 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xd8);
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/bsp/../sockets/../threads/../map/map_kernel_c.h"
                          );
  std::operator<<(poVar4,".\n");
  poVar4 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar4 = std::operator<<(poVar4,
                           "typename map_base::range_type &dlib::map_kernel_c<dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>>::operator[](const domain &) [map_base = dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>]"
                          );
  std::operator<<(poVar4,".\n\n");
  poVar4 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar4 = std::operator<<(poVar4,"this->is_in_domain(d)");
  std::operator<<(poVar4,".\n");
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar4 = std::operator<<((ostream *)&dlib_o_out,"\trange& map::operator[]");
  poVar4 = std::operator<<(poVar4,"\n\td must be in the domain of the map");
  poVar4 = std::operator<<(poVar4,"\n\tthis: ");
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  std::operator<<(poVar4,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

typename map_base::range_type& map_kernel_c<map_base>::
    operator[] (
        const domain& d
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( this->is_in_domain(d),
            "\trange& map::operator[]"
            << "\n\td must be in the domain of the map"
            << "\n\tthis: " << this
            );

        // call the real function
        return map_base::operator[](d);
    }